

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void __thiscall
httplib::detail::SocketStream::SocketStream
          (SocketStream *this,socket_t sock,time_t read_timeout_sec,time_t read_timeout_usec,
          time_t write_timeout_sec,time_t write_timeout_usec,time_t max_timeout_msec,
          time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
          start_time)

{
  _func_int **in_RCX;
  _func_int **in_RDX;
  undefined4 in_ESI;
  Stream *in_RDI;
  _func_int **in_R8;
  _func_int **in_R9;
  _func_int **in_stack_00000008;
  _func_int **in_stack_00000010;
  allocator_type *__a;
  value_type *in_stack_ffffffffffffffb0;
  size_type in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 uVar1;
  
  Stream::Stream(in_RDI);
  in_RDI->_vptr_Stream = (_func_int **)&PTR__SocketStream_0052eb38;
  *(undefined4 *)&in_RDI[1]._vptr_Stream = in_ESI;
  in_RDI[2]._vptr_Stream = in_RDX;
  in_RDI[3]._vptr_Stream = in_RCX;
  in_RDI[4]._vptr_Stream = in_R8;
  in_RDI[5]._vptr_Stream = in_R9;
  in_RDI[6]._vptr_Stream = in_stack_00000008;
  in_RDI[7]._vptr_Stream = in_stack_00000010;
  uVar1 = 0;
  __a = (allocator_type *)&stack0xffffffffffffffc6;
  ::std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)CONCAT17(uVar1,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,__a);
  ::std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc6);
  in_RDI[0xb]._vptr_Stream = (_func_int **)0x0;
  in_RDI[0xc]._vptr_Stream = (_func_int **)0x0;
  return;
}

Assistant:

inline SocketStream::SocketStream(
    socket_t sock, time_t read_timeout_sec, time_t read_timeout_usec,
    time_t write_timeout_sec, time_t write_timeout_usec,
    time_t max_timeout_msec,
    std::chrono::time_point<std::chrono::steady_clock> start_time)
    : sock_(sock), read_timeout_sec_(read_timeout_sec),
      read_timeout_usec_(read_timeout_usec),
      write_timeout_sec_(write_timeout_sec),
      write_timeout_usec_(write_timeout_usec),
      max_timeout_msec_(max_timeout_msec), start_time_(start_time),
      read_buff_(read_buff_size_, 0) {}